

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.h
# Opt level: O3

void write_rbsp_trailing_bits(bs_t *b)

{
  byte *pbVar1;
  int iVar2;
  
  iVar2 = b->bits_left + -1;
  b->bits_left = iVar2;
  pbVar1 = b->p;
  if (pbVar1 < b->end) {
    *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar2 & 0x1f));
    *b->p = *b->p | (byte)(1 << ((byte)b->bits_left & 0x1f));
    iVar2 = b->bits_left;
  }
  if (iVar2 != 0) {
    if (iVar2 == 8) {
      return;
    }
    do {
      iVar2 = iVar2 + -1;
      b->bits_left = iVar2;
      pbVar1 = b->p;
      if (pbVar1 < b->end) {
        *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar2 & 0x1f));
        iVar2 = b->bits_left;
      }
      if (iVar2 == 8) {
        return;
      }
    } while (iVar2 != 0);
  }
  b->p = b->p + 1;
  b->bits_left = 8;
  return;
}

Assistant:

static inline void bs_write_u1(bs_t* b, uint32_t v)
{
    b->bits_left--;

    if (! bs_eof(b))
    {
        // FIXME this is slow, but we must clear bit first
        // is it better to memset(0) the whole buffer during bs_init() instead? 
        // if we don't do either, we introduce pretty nasty bugs
        (*(b->p)) &= ~(0x01 << b->bits_left);
        (*(b->p)) |= ((v & 0x01) << b->bits_left);
    }

    if (b->bits_left == 0) { b->p ++; b->bits_left = 8; }
}